

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xorfilter.h
# Opt level: O1

_Bool xor8_populate(uint64_t *keys,uint32_t size,xor8_t *filter)

{
  ulong *puVar1;
  uint uVar2;
  undefined4 uVar3;
  ulong uVar4;
  uint64_t uVar5;
  uint8_t *puVar6;
  size_t __size;
  long lVar7;
  void *__s;
  void *__ptr;
  void *__ptr_00;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  int *piVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  byte bVar21;
  ulong uVar22;
  undefined4 *puVar23;
  uint32_t r0;
  ulong local_b0;
  ulong local_88;
  
  if (size == 0) {
    return false;
  }
  local_b0 = (ulong)size;
  filter->seed = 0x910a2dec89025cc1;
  uVar4 = filter->blockLength;
  lVar7 = uVar4 * 0x10;
  __size = uVar4 * 0x30;
  __s = malloc(__size);
  __ptr = malloc(__size);
  __ptr_00 = malloc(local_b0 << 4);
  iVar18 = 0;
  if (__ptr_00 != (void *)0x0 && (__ptr != (void *)0x0 && __s != (void *)0x0)) {
    lVar8 = uVar4 * 0x20;
    local_88 = 0x9e3779b97f4a7c16;
    while( true ) {
      if (iVar18 + 1 == 10) {
        local_b0 = xor_sort_and_remove_dup(keys,local_b0 & 0xffffffff);
      }
      if (iVar18 == 100) {
        iVar18 = 0;
        goto LAB_00101b15;
      }
      memset(__s,0,__size);
      uVar10 = local_b0 & 0xffffffff;
      if ((int)local_b0 != 0) {
        uVar5 = filter->seed;
        uVar12 = (ulong)(uint)filter->blockLength;
        uVar16 = 0;
        do {
          uVar9 = keys[uVar16] + uVar5;
          uVar9 = (uVar9 >> 0x21 ^ uVar9) * -0xae502812aa7333;
          uVar9 = (uVar9 >> 0x21 ^ uVar9) * -0x3b314601e57a13ad;
          uVar19 = uVar9 >> 0x21 ^ uVar9;
          uVar22 = (uVar19 & 0xffffffff) * uVar12 >> 0x1c & 0xfffffffffffffff0;
          puVar1 = (ulong *)((long)__s + uVar22);
          *puVar1 = *puVar1 ^ uVar19;
          piVar13 = (int *)((long)__s + uVar22 + 8);
          *piVar13 = *piVar13 + 1;
          uVar9 = ((uint)(uVar19 << 0x15) | (uint)(uVar9 >> 0x2b)) * uVar12 >> 0x1c &
                  0xfffffffffffffff0;
          puVar1 = (ulong *)((long)__s + uVar9 + lVar7);
          *puVar1 = *puVar1 ^ uVar19;
          piVar13 = (int *)((long)__s + uVar9 + lVar7 + 8);
          *piVar13 = *piVar13 + 1;
          uVar9 = (uVar19 >> 0x16 & 0xffffffff) * uVar12 >> 0x1c & 0xfffffffffffffff0;
          puVar1 = (ulong *)((long)__s + uVar9 + lVar8);
          *puVar1 = *puVar1 ^ uVar19;
          piVar13 = (int *)((long)__s + uVar9 + lVar8 + 8);
          *piVar13 = *piVar13 + 1;
          uVar16 = uVar16 + 1;
        } while (uVar10 != uVar16);
      }
      uVar12 = filter->blockLength;
      if (uVar12 == 0) {
        lVar11 = 0;
      }
      else {
        lVar11 = 0;
        uVar16 = 0;
        piVar13 = (int *)((long)__s + 8);
        do {
          if (*piVar13 == 1) {
            *(int *)((long)__ptr + lVar11 * 0x10 + 8) = (int)uVar16;
            *(undefined8 *)((long)__ptr + lVar11 * 0x10) = *(undefined8 *)(piVar13 + -2);
            lVar11 = lVar11 + 1;
          }
          uVar16 = uVar16 + 1;
          piVar13 = piVar13 + 4;
        } while (uVar12 != uVar16);
      }
      if (uVar12 == 0) {
        lVar14 = 0;
      }
      else {
        lVar14 = 0;
        uVar16 = 0;
        piVar13 = (int *)((long)__s + lVar7 + 8);
        do {
          if (*piVar13 == 1) {
            *(int *)((long)__ptr + lVar14 * 0x10 + lVar7 + 8) = (int)uVar16;
            *(undefined8 *)((long)__ptr + lVar14 * 0x10 + lVar7) = *(undefined8 *)(piVar13 + -2);
            lVar14 = lVar14 + 1;
          }
          uVar16 = uVar16 + 1;
          piVar13 = piVar13 + 4;
        } while (uVar12 != uVar16);
      }
      if (uVar12 == 0) {
        lVar17 = 0;
      }
      else {
        lVar17 = 0;
        uVar16 = 0;
        piVar13 = (int *)((long)__s + lVar8 + 8);
        do {
          if (*piVar13 == 1) {
            *(int *)((long)__ptr + lVar17 * 0x10 + lVar8 + 8) = (int)uVar16;
            *(undefined8 *)((long)__ptr + lVar17 * 0x10 + lVar8) = *(undefined8 *)(piVar13 + -2);
            lVar17 = lVar17 + 1;
          }
          uVar16 = uVar16 + 1;
          piVar13 = piVar13 + 4;
        } while (uVar12 != uVar16);
      }
      if (lVar11 + lVar14 + lVar17 == 0) {
        uVar16 = 0;
      }
      else {
        uVar12 = uVar12 & 0xffffffff;
        uVar16 = 0;
        do {
          if (lVar11 != 0) {
            puVar23 = (undefined4 *)((long)__ptr + lVar11 * 0x10 + -4);
            do {
              uVar2 = puVar23[-1];
              if (*(int *)((long)__s + (ulong)uVar2 * 0x10 + 8) != 0) {
                uVar9 = *(ulong *)(puVar23 + -3);
                uVar3 = *puVar23;
                uVar22 = ((uint)(uVar9 << 0x15) | (uint)(uVar9 >> 0x2b)) * uVar12;
                lVar20 = uVar16 * 0x10;
                *(ulong *)((long)__ptr_00 + lVar20) = uVar9;
                *(uint *)((long)__ptr_00 + lVar20 + 8) = uVar2;
                *(undefined4 *)((long)__ptr_00 + lVar20 + 0xc) = uVar3;
                lVar20 = (uVar22 >> 0x20) * 0x10;
                uVar19 = *(ulong *)((long)__s + lVar20 + lVar7) ^ uVar9;
                *(ulong *)((long)__s + lVar20 + lVar7) = uVar19;
                iVar15 = *(int *)((long)__s + lVar20 + lVar7 + 8) + -1;
                *(int *)((long)__s + lVar20 + lVar7 + 8) = iVar15;
                if (iVar15 == 1) {
                  *(int *)((long)__ptr + lVar14 * 0x10 + lVar7 + 8) = (int)(uVar22 >> 0x20);
                  *(ulong *)((long)__ptr + lVar14 * 0x10 + lVar7) = uVar19;
                  lVar14 = lVar14 + 1;
                }
                uVar19 = (uVar9 >> 0x16 & 0xffffffff) * uVar12;
                uVar16 = uVar16 + 1;
                lVar20 = (uVar19 >> 0x20) * 0x10;
                uVar9 = uVar9 ^ *(ulong *)((long)__s + lVar20 + lVar8);
                *(ulong *)((long)__s + lVar20 + lVar8) = uVar9;
                iVar15 = *(int *)((long)__s + lVar20 + lVar8 + 8) + -1;
                *(int *)((long)__s + lVar20 + lVar8 + 8) = iVar15;
                if (iVar15 == 1) {
                  *(int *)((long)__ptr + lVar17 * 0x10 + lVar8 + 8) = (int)(uVar19 >> 0x20);
                  *(ulong *)((long)__ptr + lVar17 * 0x10 + lVar8) = uVar9;
                  lVar17 = lVar17 + 1;
                }
              }
              lVar11 = lVar11 + -1;
              puVar23 = puVar23 + -4;
            } while (lVar11 != 0);
          }
          if (lVar14 == 0) {
            lVar11 = 0;
          }
          else {
            puVar23 = (undefined4 *)((long)__ptr + lVar14 * 0x10 + lVar7 + -4);
            lVar11 = 0;
            do {
              uVar2 = puVar23[-1];
              if (*(int *)((long)__s + (ulong)uVar2 * 0x10 + lVar7 + 8) != 0) {
                uVar9 = *(ulong *)(puVar23 + -3);
                uVar3 = *puVar23;
                uVar22 = (uVar9 & 0xffffffff) * uVar12;
                lVar20 = uVar16 * 0x10;
                *(ulong *)((long)__ptr_00 + lVar20) = uVar9;
                *(uint *)((long)__ptr_00 + lVar20 + 8) = uVar2 + (int)uVar4;
                *(undefined4 *)((long)__ptr_00 + lVar20 + 0xc) = uVar3;
                lVar20 = (uVar22 >> 0x20) * 0x10;
                uVar19 = *(ulong *)((long)__s + lVar20) ^ uVar9;
                *(ulong *)((long)__s + lVar20) = uVar19;
                iVar15 = *(int *)((long)__s + lVar20 + 8) + -1;
                *(int *)((long)__s + lVar20 + 8) = iVar15;
                if (iVar15 == 1) {
                  *(int *)((long)__ptr + lVar11 * 0x10 + 8) = (int)(uVar22 >> 0x20);
                  *(ulong *)((long)__ptr + lVar11 * 0x10) = uVar19;
                  lVar11 = lVar11 + 1;
                }
                uVar19 = (uVar9 >> 0x16 & 0xffffffff) * uVar12;
                uVar16 = uVar16 + 1;
                lVar20 = (uVar19 >> 0x20) * 0x10;
                uVar9 = uVar9 ^ *(ulong *)((long)__s + lVar20 + lVar8);
                *(ulong *)((long)__s + lVar20 + lVar8) = uVar9;
                iVar15 = *(int *)((long)__s + lVar20 + lVar8 + 8) + -1;
                *(int *)((long)__s + lVar20 + lVar8 + 8) = iVar15;
                if (iVar15 == 1) {
                  *(int *)((long)__ptr + lVar17 * 0x10 + lVar8 + 8) = (int)(uVar19 >> 0x20);
                  *(ulong *)((long)__ptr + lVar17 * 0x10 + lVar8) = uVar9;
                  lVar17 = lVar17 + 1;
                }
              }
              lVar14 = lVar14 + -1;
              puVar23 = puVar23 + -4;
            } while (lVar14 != 0);
          }
          if (lVar17 == 0) {
            lVar14 = 0;
          }
          else {
            puVar23 = (undefined4 *)((long)__ptr + lVar17 * 0x10 + lVar8 + -4);
            lVar14 = 0;
            do {
              uVar2 = puVar23[-1];
              if (*(int *)((long)__s + (ulong)uVar2 * 0x10 + lVar8 + 8) != 0) {
                uVar9 = *(ulong *)(puVar23 + -3);
                uVar3 = *puVar23;
                uVar22 = (uVar9 & 0xffffffff) * uVar12;
                lVar20 = uVar16 * 0x10;
                *(ulong *)((long)__ptr_00 + lVar20) = uVar9;
                *(uint *)((long)__ptr_00 + lVar20 + 8) = uVar2 + (int)uVar4 * 2;
                *(undefined4 *)((long)__ptr_00 + lVar20 + 0xc) = uVar3;
                lVar20 = (uVar22 >> 0x20) * 0x10;
                uVar19 = *(ulong *)((long)__s + lVar20) ^ uVar9;
                *(ulong *)((long)__s + lVar20) = uVar19;
                iVar15 = *(int *)((long)__s + lVar20 + 8) + -1;
                *(int *)((long)__s + lVar20 + 8) = iVar15;
                if (iVar15 == 1) {
                  *(int *)((long)__ptr + lVar11 * 0x10 + 8) = (int)(uVar22 >> 0x20);
                  *(ulong *)((long)__ptr + lVar11 * 0x10) = uVar19;
                  lVar11 = lVar11 + 1;
                }
                uVar19 = ((uint)(uVar9 << 0x15) | (uint)(uVar9 >> 0x2b)) * uVar12;
                uVar16 = uVar16 + 1;
                lVar20 = (uVar19 >> 0x20) * 0x10;
                uVar9 = uVar9 ^ *(ulong *)((long)__s + lVar20 + lVar7);
                *(ulong *)((long)__s + lVar20 + lVar7) = uVar9;
                iVar15 = *(int *)((long)__s + lVar20 + lVar7 + 8) + -1;
                *(int *)((long)__s + lVar20 + lVar7 + 8) = iVar15;
                if (iVar15 == 1) {
                  *(int *)((long)__ptr + lVar14 * 0x10 + lVar7 + 8) = (int)(uVar19 >> 0x20);
                  *(ulong *)((long)__ptr + lVar14 * 0x10 + lVar7) = uVar9;
                  lVar14 = lVar14 + 1;
                }
              }
              lVar17 = lVar17 + -1;
              puVar23 = puVar23 + -4;
            } while (lVar17 != 0);
          }
          lVar17 = 0;
        } while (lVar11 + lVar14 != 0);
      }
      if (uVar16 == uVar10) break;
      local_88 = local_88 + 0x9e3779b97f4a7c15;
      uVar10 = (local_88 >> 0x1e ^ local_88) * -0x40a7b892e31b1a47;
      uVar10 = (uVar10 >> 0x1b ^ uVar10) * -0x6b2fb644ecceee15;
      filter->seed = uVar10 >> 0x1f ^ uVar10;
      iVar18 = iVar18 + 1;
    }
    iVar18 = 1;
    if ((int)local_b0 != 0) {
      puVar6 = filter->fingerprints;
      lVar7 = uVar10 << 4;
      do {
        uVar10 = *(ulong *)((long)__ptr_00 + lVar7 + -0x10);
        uVar12 = (ulong)*(uint *)((long)__ptr_00 + lVar7 + -8);
        uVar16 = (ulong)(uint)filter->blockLength;
        if (uVar12 < uVar4) {
          bVar21 = puVar6[(((uint)(uVar10 << 0x15) | (uint)(uVar10 >> 0x2b)) * uVar16 >> 0x20) +
                          uVar4];
LAB_00101abd:
          uVar19 = uVar10 >> 0x16;
          uVar9 = uVar4 * 2;
        }
        else {
          bVar21 = puVar6[(uVar10 & 0xffffffff) * uVar16 >> 0x20];
          if (uVar12 < uVar4 * 2) goto LAB_00101abd;
          uVar19 = uVar10 << 0x15 | uVar10 >> 0x2b;
          uVar9 = uVar4;
        }
        filter->fingerprints[uVar12] =
             (byte)(uVar10 >> 0x20) ^ (byte)uVar10 ^
             bVar21 ^ puVar6[(uVar16 * (uVar19 & 0xffffffff) >> 0x20) + uVar9];
        lVar7 = lVar7 + -0x10;
      } while (lVar7 != 0);
      iVar18 = 1;
    }
  }
LAB_00101b15:
  free(__s);
  free(__ptr);
  free(__ptr_00);
  return SUB41(iVar18,0);
}

Assistant:

static inline bool xor8_populate(uint64_t *keys, uint32_t size, xor8_t *filter) {
  if(size == 0) { return false; }
  uint64_t rng_counter = 1;
  filter->seed = xor_rng_splitmix64(&rng_counter);
  size_t arrayLength = (size_t)(filter->blockLength) * 3; // size of the backing array
  size_t blockLength = (size_t)(filter->blockLength);

  xor_xorset_t *sets =
      (xor_xorset_t *)malloc(arrayLength * sizeof(xor_xorset_t));

  xor_keyindex_t *Q =
      (xor_keyindex_t *)malloc(arrayLength * sizeof(xor_keyindex_t));

  xor_keyindex_t *stack =
      (xor_keyindex_t *)malloc(size * sizeof(xor_keyindex_t));

  if ((sets == NULL) || (Q == NULL) || (stack == NULL)) {
    free(sets);
    free(Q);
    free(stack);
    return false;
  }
  xor_xorset_t *sets0 = sets;
  xor_xorset_t *sets1 = sets + blockLength;
  xor_xorset_t *sets2 = sets + 2 * blockLength;
  xor_keyindex_t *Q0 = Q;
  xor_keyindex_t *Q1 = Q + blockLength;
  xor_keyindex_t *Q2 = Q + 2 * blockLength;

  int iterations = 0;

  while (true) {
    iterations ++;
    if(iterations == XOR_SORT_ITERATIONS) {
      size = (uint32_t)xor_sort_and_remove_dup(keys, size);
    }
    if(iterations > XOR_MAX_ITERATIONS) {
      // The probability of this happening is lower than the
      // the cosmic-ray probability (i.e., a cosmic ray corrupts your system).
      free(sets);
      free(Q);
      free(stack);
      return false;
    }

    memset(sets, 0, sizeof(xor_xorset_t) * arrayLength);
    for (size_t i = 0; i < size; i++) {
      uint64_t key = keys[i];
      xor_hashes_t hs = xor8_get_h0_h1_h2(key, filter);
      sets0[hs.h0].xormask ^= hs.h;
      sets0[hs.h0].count++;
      sets1[hs.h1].xormask ^= hs.h;
      sets1[hs.h1].count++;
      sets2[hs.h2].xormask ^= hs.h;
      sets2[hs.h2].count++;
    }
    // todo: the flush should be sync with the detection that follows
    // scan for values with a count of one
    size_t Q0size = 0, Q1size = 0, Q2size = 0;
    for (size_t i = 0; i < filter->blockLength; i++) {
      if (sets0[i].count == 1) {
        Q0[Q0size].index = (uint32_t)i;
        Q0[Q0size].hash = sets0[i].xormask;
        Q0size++;
      }
    }

    for (size_t i = 0; i < filter->blockLength; i++) {
      if (sets1[i].count == 1) {
        Q1[Q1size].index = (uint32_t)i;
        Q1[Q1size].hash = sets1[i].xormask;
        Q1size++;
      }
    }
    for (size_t i = 0; i < filter->blockLength; i++) {
      if (sets2[i].count == 1) {
        Q2[Q2size].index = (uint32_t)i;
        Q2[Q2size].hash = sets2[i].xormask;
        Q2size++;
      }
    }

    size_t stack_size = 0;
    while (Q0size + Q1size + Q2size > 0) {
      while (Q0size > 0) {
        xor_keyindex_t keyindex = Q0[--Q0size];
        size_t index = keyindex.index;
        if (sets0[index].count == 0)
          continue; // not actually possible after the initial scan.
        //sets0[index].count = 0;
        uint64_t hash = keyindex.hash;
        uint32_t h1 = xor8_get_h1(hash, filter);
        uint32_t h2 = xor8_get_h2(hash, filter);

        stack[stack_size] = keyindex;
        stack_size++;
        sets1[h1].xormask ^= hash;
        sets1[h1].count--;
        if (sets1[h1].count == 1) {
          Q1[Q1size].index = h1;
          Q1[Q1size].hash = sets1[h1].xormask;
          Q1size++;
        }
        sets2[h2].xormask ^= hash;
        sets2[h2].count--;
        if (sets2[h2].count == 1) {
          Q2[Q2size].index = h2;
          Q2[Q2size].hash = sets2[h2].xormask;
          Q2size++;
        }
      }
      while (Q1size > 0) {
        xor_keyindex_t keyindex = Q1[--Q1size];
        size_t index = keyindex.index;
        if (sets1[index].count == 0)
          continue;
        //sets1[index].count = 0;
        uint64_t hash = keyindex.hash;
        uint32_t h0 = xor8_get_h0(hash, filter);
        uint32_t h2 = xor8_get_h2(hash, filter);
        keyindex.index += (uint32_t)blockLength;
        stack[stack_size] = keyindex;
        stack_size++;
        sets0[h0].xormask ^= hash;
        sets0[h0].count--;
        if (sets0[h0].count == 1) {
          Q0[Q0size].index = h0;
          Q0[Q0size].hash = sets0[h0].xormask;
          Q0size++;
        }
        sets2[h2].xormask ^= hash;
        sets2[h2].count--;
        if (sets2[h2].count == 1) {
          Q2[Q2size].index = h2;
          Q2[Q2size].hash = sets2[h2].xormask;
          Q2size++;
        }
      }
      while (Q2size > 0) {
        xor_keyindex_t keyindex = Q2[--Q2size];
        size_t index = keyindex.index;
        if (sets2[index].count == 0)
          continue;

        //sets2[index].count = 0;
        uint64_t hash = keyindex.hash;

        uint32_t h0 = xor8_get_h0(hash, filter);
        uint32_t h1 = xor8_get_h1(hash, filter);
        keyindex.index += 2 * (uint32_t)blockLength;

        stack[stack_size] = keyindex;
        stack_size++;
        sets0[h0].xormask ^= hash;
        sets0[h0].count--;
        if (sets0[h0].count == 1) {
          Q0[Q0size].index = h0;
          Q0[Q0size].hash = sets0[h0].xormask;
          Q0size++;
        }
        sets1[h1].xormask ^= hash;
        sets1[h1].count--;
        if (sets1[h1].count == 1) {
          Q1[Q1size].index = h1;
          Q1[Q1size].hash = sets1[h1].xormask;
          Q1size++;
        }

      }
    }
    if (stack_size == size) {
      // success
      break;
    }

    filter->seed = xor_rng_splitmix64(&rng_counter);
  }
  uint8_t * fingerprints0 = filter->fingerprints;
  uint8_t * fingerprints1 = filter->fingerprints + blockLength;
  uint8_t * fingerprints2 = filter->fingerprints + 2 * blockLength;

  size_t stack_size = size;
  while (stack_size > 0) {
    xor_keyindex_t ki = stack[--stack_size];
    uint64_t val = xor_fingerprint(ki.hash);
    if(ki.index < blockLength) {
      val ^= (uint32_t)fingerprints1[xor8_get_h1(ki.hash,filter)] ^ fingerprints2[xor8_get_h2(ki.hash,filter)];
    } else if(ki.index < 2 * blockLength) {
      val ^= (uint32_t)fingerprints0[xor8_get_h0(ki.hash,filter)] ^ fingerprints2[xor8_get_h2(ki.hash,filter)];
    } else {
      val ^= (uint32_t)fingerprints0[xor8_get_h0(ki.hash,filter)] ^ fingerprints1[xor8_get_h1(ki.hash,filter)];
    }
    filter->fingerprints[ki.index] = (uint8_t)val;
  }

  free(sets);
  free(Q);
  free(stack);
  return true;
}